

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_instance.cpp
# Opt level: O1

XrResult LoaderInstance::CreateInstance
                   (PFN_xrGetInstanceProcAddr get_instance_proc_addr_term,
                   PFN_xrCreateInstance create_instance_term,
                   PFN_xrCreateApiLayerInstance create_api_layer_instance_term,
                   vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                   *api_layer_interfaces,XrInstanceCreateInfo *info,
                   unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_> *loader_instance
                   )

{
  byte bVar1;
  RuntimeInterface *pRVar2;
  pointer puVar3;
  ApiLayerInterface *pAVar4;
  PFN_xrCreateApiLayerInstance p_Var5;
  _Alloc_hider _Var6;
  LoaderInstance *pLVar7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_> *puVar10;
  iterator iVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_> *puVar15;
  XrApiLayerNextInfo *pXVar16;
  LoaderInstance *this;
  size_t *psVar17;
  iterator __dest;
  XrApiLayerNextInfo *pXVar18;
  PFN_xrGetInstanceProcAddr p_Var19;
  ulong uVar20;
  char **ppcVar21;
  char *pcVar22;
  const_iterator __begin2;
  pointer puVar23;
  long lVar24;
  pointer pXVar25;
  pointer puVar26;
  ulong uVar27;
  XrInstanceCreateInfo *pXVar28;
  vector<const_char_*,_std::allocator<const_char_*>_> extensions_to_skip;
  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  *__range3;
  XrInstance instance;
  InstanceCreateInfoManager create_info_manager;
  string msg;
  XrResult local_460;
  undefined1 local_448 [40];
  XrApiLayerNextInfo *local_420;
  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  *local_418;
  PFN_xrGetInstanceProcAddr local_410;
  PFN_xrCreateApiLayerInstance local_408;
  XrInstance local_400;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_3f8;
  XrInstanceCreateInfo *local_3e0;
  unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_> *local_3d8;
  undefined1 local_3d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0 [19];
  undefined4 local_290;
  char **local_288;
  char **local_280;
  iterator iStack_278;
  char **local_270;
  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  local_268;
  undefined1 local_250 [112];
  ios_base local_1e0 [424];
  XrApiLayerNextInfo *local_38;
  
  local_420 = (XrApiLayerNextInfo *)create_instance_term;
  local_418 = api_layer_interfaces;
  local_408 = create_api_layer_instance_term;
  local_250._0_8_ = local_250 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"xrCreateInstance","");
  local_3d0._0_8_ = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3d0,"Entering LoaderInstance::CreateInstance","");
  local_448._0_8_ = (pointer)0x0;
  local_448._8_8_ = (pointer)0x0;
  local_448._16_8_ = (pointer)0x0;
  LoaderLogger::LogVerboseMessage
            ((string *)local_250,(string *)local_3d0,
             (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_448);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
            ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_448);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._0_8_ != local_3c0) {
    operator_delete((void *)local_3d0._0_8_,local_3c0[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
    operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
  }
  local_410 = get_instance_proc_addr_term;
  local_3d8 = loader_instance;
  if (info->enabledExtensionCount == 0) {
    local_460 = XR_SUCCESS;
  }
  else {
    uVar27 = 0;
    local_460 = XR_SUCCESS;
    do {
      puVar15 = RuntimeInterface::GetInstance();
      pRVar2 = (puVar15->_M_t).
               super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>._M_t.
               super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>.
               super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl;
      std::__cxx11::string::string
                ((string *)local_250,info->enabledExtensionNames[uVar27],(allocator *)local_3d0);
      bVar12 = RuntimeInterface::SupportsExtension(pRVar2,(string *)local_250);
      if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      if ((!bVar12) &&
         (iVar14 = strcmp(LoaderSpecificExtensions::extensions._M_elems[0].extensionName,
                          info->enabledExtensionNames[uVar27]), iVar14 == 0)) {
        bVar12 = true;
      }
      if (bVar12 == false) {
        puVar3 = (local_418->
                 super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        puVar26 = (local_418->
                  super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (puVar3 != puVar26) {
          bVar12 = false;
          do {
            puVar23 = puVar3 + 1;
            pAVar4 = (puVar3->_M_t).
                     super___uniq_ptr_impl<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ApiLayerInterface_*,_std::default_delete<ApiLayerInterface>_>
                     .super__Head_base<0UL,_ApiLayerInterface_*,_false>._M_head_impl;
            std::__cxx11::string::string
                      ((string *)local_250,info->enabledExtensionNames[uVar27],
                       (allocator *)local_3d0);
            bVar13 = ApiLayerInterface::SupportsExtension(pAVar4,(string *)local_250);
            if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
              operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
            }
            if (bVar13) {
              bVar12 = true;
            }
            puVar3 = puVar23;
          } while (puVar23 != puVar26 && !bVar13);
        }
      }
      if (bVar12 == false) {
        local_250._0_8_ = local_250 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_250,
                   "LoaderInstance::CreateInstance, no support found for requested extension: ","");
        std::__cxx11::string::append((char *)local_250);
        local_3d0._0_8_ = local_3c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"xrCreateInstance","");
        local_448._0_8_ = (pointer)0x0;
        local_448._8_8_ = (pointer)0x0;
        local_448._16_8_ = (pointer)0x0;
        LoaderLogger::LogErrorMessage
                  ((string *)local_3d0,(string *)local_250,
                   (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_448);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                  ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_448);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._0_8_ != local_3c0) {
          operator_delete((void *)local_3d0._0_8_,local_3c0[0]._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
          operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
        }
        local_460 = XR_ERROR_EXTENSION_NOT_PRESENT;
      }
    } while ((bVar12 != false) && (uVar27 = uVar27 + 1, uVar27 < info->enabledExtensionCount));
  }
  local_400 = (XrInstance)0x0;
  p_Var19 = local_410;
  if (XR_ERROR_VALIDATION_FAILURE < local_460) {
    local_3d0._0_8_ = info;
    memcpy(local_3d0 + 8,info,0x148);
    local_280 = (char **)0x0;
    local_270 = (char **)0x0;
    iStack_278._M_current = (char **)0x0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_280,
               (ulong)info->enabledExtensionCount);
    if (*(int *)(local_3d0._0_8_ + 0x138) != 0) {
      lVar24 = 0;
      uVar27 = 0;
      do {
        if (iStack_278._M_current == local_270) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                    ((vector<char_const*,std::allocator<char_const*>> *)&local_280,iStack_278,
                     (char **)(*(long *)(local_3d0._0_8_ + 0x140) + lVar24));
        }
        else {
          *iStack_278._M_current = *(char **)(*(long *)(local_3d0._0_8_ + 0x140) + lVar24);
          iStack_278._M_current = iStack_278._M_current + 1;
        }
        uVar27 = uVar27 + 1;
        lVar24 = lVar24 + 8;
      } while (uVar27 < *(uint *)(local_3d0._0_8_ + 0x138));
    }
    local_288 = (char **)0x0;
    if ((long)iStack_278._M_current - (long)local_280 != 0) {
      local_288 = local_280;
    }
    local_290 = (undefined4)((ulong)((long)iStack_278._M_current - (long)local_280) >> 3);
    pXVar28 = info;
    if (info->enabledExtensionCount != 0) {
      local_448._0_8_ = (pointer)0x0;
      local_448._8_8_ = (pointer)0x0;
      local_448._16_8_ = (pointer)0x0;
      puVar15 = RuntimeInterface::GetInstance();
      pRVar2 = (puVar15->_M_t).
               super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>._M_t.
               super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>.
               super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl;
      local_250._0_8_ = local_250 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_250,0x13c1b0,0x13c1c2);
      bVar12 = RuntimeInterface::SupportsExtension(pRVar2,(string *)local_250);
      if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      if (!bVar12) {
        if (local_448._8_8_ == local_448._16_8_) {
          std::vector<char_const*,std::allocator<char_const*>>::
          _M_realloc_insert<char_const(&)[128]>
                    ((vector<char_const*,std::allocator<char_const*>> *)local_448,
                     (iterator)local_448._8_8_,
                     &LoaderSpecificExtensions::extensions._M_elems[0].extensionName);
        }
        else {
          *(char **)local_448._8_8_ = LoaderSpecificExtensions::extensions._M_elems[0].extensionName
          ;
          local_448._8_8_ = local_448._8_8_ + 8;
        }
      }
      uVar9 = local_448._8_8_;
      if ((local_280 != iStack_278._M_current) &&
         (pXVar25 = (pointer)local_448._0_8_, local_448._0_8_ != local_448._8_8_)) {
        do {
          iVar11._M_current = iStack_278._M_current;
          if (local_280 != iStack_278._M_current) {
            pcVar22 = (char *)pXVar25->handle;
            lVar24 = (long)iStack_278._M_current - (long)local_280 >> 5;
            ppcVar21 = local_280;
            if (0 < lVar24) {
              ppcVar21 = (char **)(((long)iStack_278._M_current - (long)local_280 &
                                   0xffffffffffffffe0U) + (long)local_280);
              lVar24 = lVar24 + 1;
              __dest._M_current = local_280 + 2;
              do {
                iVar14 = strcmp(pcVar22,__dest._M_current[-2]);
                if (iVar14 == 0) {
                  __dest._M_current = __dest._M_current + -2;
                  goto LAB_00111a5a;
                }
                iVar14 = strcmp(pcVar22,__dest._M_current[-1]);
                if (iVar14 == 0) {
                  __dest._M_current = __dest._M_current + -1;
                  goto LAB_00111a5a;
                }
                iVar14 = strcmp(pcVar22,*__dest._M_current);
                if (iVar14 == 0) goto LAB_00111a5a;
                iVar14 = strcmp(pcVar22,__dest._M_current[1]);
                if (iVar14 == 0) {
                  __dest._M_current = __dest._M_current + 1;
                  goto LAB_00111a5a;
                }
                lVar24 = lVar24 + -1;
                __dest._M_current = __dest._M_current + 4;
              } while (1 < lVar24);
            }
            lVar24 = (long)iVar11._M_current - (long)ppcVar21 >> 3;
            if (lVar24 == 1) {
LAB_00111a2a:
              iVar14 = strcmp(pcVar22,*ppcVar21);
              __dest._M_current = ppcVar21;
              if (iVar14 != 0) {
                __dest._M_current = iVar11._M_current;
              }
            }
            else {
              __dest._M_current = ppcVar21;
              if (lVar24 == 2) {
LAB_00111a11:
                iVar14 = strcmp(pcVar22,*__dest._M_current);
                if (iVar14 != 0) {
                  ppcVar21 = __dest._M_current + 1;
                  goto LAB_00111a2a;
                }
              }
              else {
                __dest._M_current = iVar11._M_current;
                if ((lVar24 == 3) &&
                   (iVar14 = strcmp(pcVar22,*ppcVar21), __dest._M_current = ppcVar21, iVar14 != 0))
                {
                  __dest._M_current = ppcVar21 + 1;
                  goto LAB_00111a11;
                }
              }
            }
LAB_00111a5a:
            if (__dest._M_current != iVar11._M_current) {
              ppcVar21 = __dest._M_current + 1;
              if (ppcVar21 != iVar11._M_current) {
                memmove(__dest._M_current,ppcVar21,(long)iVar11._M_current - (long)ppcVar21);
              }
              iStack_278._M_current = iStack_278._M_current + -1;
            }
            local_288 = local_280;
            if ((long)iStack_278._M_current - (long)local_280 == 0) {
              local_288 = (char **)0x0;
            }
            local_290 = (undefined4)((ulong)((long)iStack_278._M_current - (long)local_280) >> 3);
          }
          pXVar25 = (pointer)&pXVar25->type;
        } while (pXVar25 != (pointer)uVar9);
        local_288 = (char **)0x0;
        if ((long)iStack_278._M_current - (long)local_280 != 0) {
          local_288 = local_280;
        }
        local_290 = (undefined4)((ulong)((long)iStack_278._M_current - (long)local_280) >> 3);
      }
      pXVar28 = (XrInstanceCreateInfo *)(local_3d0 + 8);
      if ((pointer)local_448._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_448._0_8_,local_448._16_8_ - local_448._0_8_);
      }
    }
    puVar3 = (local_418->
             super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar26 = (local_418->
              super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (puVar3 == puVar26) {
      local_460 = (*(code *)local_420)(pXVar28,&local_400);
      p_Var19 = local_410;
    }
    else {
      uVar20 = (long)puVar26 - (long)puVar3 >> 3;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar20;
      uVar27 = 0xffffffffffffffff;
      if (SUB168(auVar8 * ZEXT816(0x128),8) == 0) {
        uVar27 = SUB168(auVar8 * ZEXT816(0x128),0);
      }
      pXVar16 = (XrApiLayerNextInfo *)operator_new__(uVar27);
      lVar24 = uVar20 + (uVar20 == 0);
      psVar17 = &pXVar16->structSize;
      do {
        ((XrApiLayerNextInfo *)(psVar17 + -1))->structType =
             XR_LOADER_INTERFACE_STRUCT_API_LAYER_NEXT_INFO;
        ((XrApiLayerNextInfo *)(psVar17 + -1))->structVersion = 1;
        *psVar17 = 0x128;
        psVar17 = psVar17 + 0x25;
        lVar24 = lVar24 + -1;
      } while (lVar24 != 0);
      local_3e0 = pXVar28;
      if (puVar26 !=
          (local_418->
          super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start) {
        pcVar22 = pXVar16[uVar20 - 1].layerName;
        pXVar18 = (XrApiLayerNextInfo *)0x0;
        local_420 = pXVar16;
        do {
          pAVar4 = puVar26[-1]._M_t.
                   super___uniq_ptr_impl<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ApiLayerInterface_*,_std::default_delete<ApiLayerInterface>_>
                   .super__Head_base<0UL,_ApiLayerInterface_*,_false>._M_head_impl;
          p_Var19 = pAVar4->_get_instance_proc_addr;
          p_Var5 = pAVar4->_create_api_layer_instance;
          pAVar4 = puVar26[-1]._M_t.
                   super___uniq_ptr_impl<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ApiLayerInterface_*,_std::default_delete<ApiLayerInterface>_>
                   .super__Head_base<0UL,_ApiLayerInterface_*,_false>._M_head_impl;
          _Var6._M_p = (pAVar4->_layer_name)._M_dataplus._M_p;
          local_250._0_8_ = local_250 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_250,_Var6._M_p,
                     _Var6._M_p + (pAVar4->_layer_name)._M_string_length);
          uVar9 = local_250._0_8_;
          strncpy(pcVar22,(char *)local_250._0_8_,0xff);
          if ((undefined1 *)uVar9 != local_250 + 0x10) {
            operator_delete((void *)uVar9,local_250._16_8_ + 1);
          }
          uVar20 = uVar20 - 1;
          puVar26 = puVar26 + -1;
          pcVar22[0xff] = '\0';
          *(XrApiLayerNextInfo **)(pcVar22 + 0x110) = pXVar18;
          pXVar18 = local_420 + uVar20;
          *(PFN_xrGetInstanceProcAddr *)(pcVar22 + 0x100) = local_410;
          *(PFN_xrCreateApiLayerInstance *)(pcVar22 + 0x108) = local_408;
          pcVar22 = pcVar22 + -0x128;
          pXVar16 = local_420;
          local_410 = p_Var19;
          local_408 = p_Var5;
        } while (puVar26 !=
                 (local_418->
                 super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
      }
      p_Var5 = local_408;
      p_Var19 = local_410;
      memset((XrApiLayerCreateInfo *)local_250,0,0x220);
      local_250._0_8_ = (char *)0x100000004;
      local_250._8_8_ = 0x220;
      local_250._16_8_ = 0;
      local_250[0x18] = '\0';
      local_38 = pXVar16;
      local_460 = (*p_Var5)(local_3e0,(XrApiLayerCreateInfo *)local_250,&local_400);
      operator_delete__(pXVar16);
    }
    if (local_460 < XR_SUCCESS) {
      local_250._0_8_ = local_250 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"xrCreateInstance","");
      local_448._0_8_ = (pointer)(local_448 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_448,
                 "LoaderInstance::CreateInstance chained CreateInstance call failed","");
      local_3f8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_3f8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3f8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      LoaderLogger::LogErrorMessage((string *)local_250,(string *)local_448,&local_3f8);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_3f8);
      if ((pointer)local_448._0_8_ != (pointer)(local_448 + 0x10)) {
        operator_delete((void *)local_448._0_8_,(ulong)(local_448._16_8_ + 1));
      }
      if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
    }
    if (local_280 != (char **)0x0) {
      operator_delete(local_280,(long)local_270 - (long)local_280);
    }
  }
  if (XR_ERROR_VALIDATION_FAILURE < local_460) {
    this = (LoaderInstance *)operator_new(0x58);
    local_268.
    super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (local_418->
         super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_268.
    super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (local_418->
         super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_268.
    super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (local_418->
         super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (local_418->
    super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_418->
    super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_418->
    super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LoaderInstance(this,local_400,info,p_Var19,&local_268);
    puVar10 = local_3d8;
    pLVar7 = (local_3d8->_M_t).
             super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
             super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
             super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl;
    (local_3d8->_M_t).super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>.
    _M_t.super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
    super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl = this;
    if (pLVar7 != (LoaderInstance *)0x0) {
      (*pLVar7->_vptr_LoaderInstance[1])();
    }
    std::
    vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    ::~vector(&local_268);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_250,"LoaderInstance::CreateInstance succeeded with ",0x2e);
    std::ostream::_M_insert<unsigned_long>((ulong)local_250);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_250," layers enabled and runtime interface - created instance = ",
               0x3b);
    local_448._0_8_ =
         ((puVar10->_M_t).
          super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
          super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
          super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl)->_runtime_instance;
    local_3d0._0_8_ = local_3c0;
    std::__cxx11::string::_M_construct((ulong)local_3d0,'\x12');
    *(char *)local_3d0._0_8_ = '0';
    *(char *)(local_3d0._0_8_ + 1) = 'x';
    pcVar22 = (char *)(local_3d0._0_8_ + (local_3d0._8_8_ - 1));
    lVar24 = 0;
    do {
      bVar1 = local_448[lVar24];
      *pcVar22 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 & 0xf];
      pcVar22[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 >> 4];
      lVar24 = lVar24 + 1;
      pcVar22 = pcVar22 + -2;
    } while (lVar24 != 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_250,(char *)local_3d0._0_8_,local_3d0._8_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._0_8_ != local_3c0) {
      operator_delete((void *)local_3d0._0_8_,local_3c0[0]._M_allocated_capacity + 1);
    }
    local_3d0._0_8_ = local_3c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"xrCreateInstance","");
    std::__cxx11::stringbuf::str();
    local_3f8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3f8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3f8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LoaderLogger::LogInfoMessage((string *)local_3d0,(string *)local_448,&local_3f8);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_3f8);
    if ((pointer)local_448._0_8_ != (pointer)(local_448 + 0x10)) {
      operator_delete((void *)local_448._0_8_,(ulong)(local_448._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._0_8_ != local_3c0) {
      operator_delete((void *)local_3d0._0_8_,local_3c0[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
    std::ios_base::~ios_base(local_1e0);
  }
  return local_460;
}

Assistant:

XrResult LoaderInstance::CreateInstance(PFN_xrGetInstanceProcAddr get_instance_proc_addr_term,
                                        PFN_xrCreateInstance create_instance_term,
                                        PFN_xrCreateApiLayerInstance create_api_layer_instance_term,
                                        std::vector<std::unique_ptr<ApiLayerInterface>> api_layer_interfaces,
                                        const XrInstanceCreateInfo* info, std::unique_ptr<LoaderInstance>* loader_instance) {
    LoaderLogger::LogVerboseMessage("xrCreateInstance", "Entering LoaderInstance::CreateInstance");

    // Check the list of enabled extensions to make sure something supports them, and, if we do,
    // add it to the list of enabled extensions
    XrResult last_error = XR_SUCCESS;
    for (uint32_t ext = 0; ext < info->enabledExtensionCount; ++ext) {
        bool found = false;
        // First check the runtime
        if (RuntimeInterface::GetRuntime().SupportsExtension(info->enabledExtensionNames[ext])) {
            found = true;
        }
        // Next check the loader
        if (!found) {
            for (auto& loader_extension : LoaderInstance::LoaderSpecificExtensions()) {
                if (strcmp(loader_extension.extensionName, info->enabledExtensionNames[ext]) == 0) {
                    found = true;
                    break;
                }
            }
        }
        // Finally, check the enabled layers
        if (!found) {
            for (auto& layer_interface : api_layer_interfaces) {
                if (layer_interface->SupportsExtension(info->enabledExtensionNames[ext])) {
                    found = true;
                    break;
                }
            }
        }
        if (!found) {
            std::string msg = "LoaderInstance::CreateInstance, no support found for requested extension: ";
            msg += info->enabledExtensionNames[ext];
            LoaderLogger::LogErrorMessage("xrCreateInstance", msg);
            last_error = XR_ERROR_EXTENSION_NOT_PRESENT;
            break;
        }
    }

    // Topmost means "closest to the application"
    PFN_xrGetInstanceProcAddr topmost_gipa = get_instance_proc_addr_term;
    XrInstance instance{XR_NULL_HANDLE};

    if (XR_SUCCEEDED(last_error)) {
        // Remove the loader-supported-extensions (debug utils), if it's in the list of enabled extensions but not supported by
        // the runtime.
        InstanceCreateInfoManager create_info_manager{info};
        const XrInstanceCreateInfo* modified_create_info = info;
        if (info->enabledExtensionCount > 0) {
            std::vector<const char*> extensions_to_skip;
            for (const auto& ext : LoaderInstance::LoaderSpecificExtensions()) {
                if (!RuntimeInterface::GetRuntime().SupportsExtension(ext.extensionName)) {
                    extensions_to_skip.emplace_back(ext.extensionName);
                }
            }
            modified_create_info = create_info_manager.FilterOutExtensions(extensions_to_skip);
        }

        // Only start the xrCreateApiLayerInstance stack if we have layers.
        if (!api_layer_interfaces.empty()) {
            // Initialize an array of ApiLayerNextInfo structs
            std::unique_ptr<XrApiLayerNextInfo[]> next_info_list(new XrApiLayerNextInfo[api_layer_interfaces.size()]);
            size_t ni_index = api_layer_interfaces.size() - 1;
            for (size_t i = 0; i <= ni_index; i++) {
                next_info_list[i].structType = XR_LOADER_INTERFACE_STRUCT_API_LAYER_NEXT_INFO;
                next_info_list[i].structVersion = XR_API_LAYER_NEXT_INFO_STRUCT_VERSION;
                next_info_list[i].structSize = sizeof(XrApiLayerNextInfo);
            }

            // Go through all layers, and override the instance pointers with the layer version.  However,
            // go backwards through the layer list so we replace in reverse order so the layers can call their next function
            // appropriately.
            PFN_xrCreateApiLayerInstance topmost_cali_fp = create_api_layer_instance_term;
            XrApiLayerNextInfo* topmost_nextinfo = nullptr;
            for (auto layer_interface = api_layer_interfaces.rbegin(); layer_interface != api_layer_interfaces.rend();
                 ++layer_interface) {
                // Collect current layer's function pointers
                PFN_xrGetInstanceProcAddr cur_gipa_fp = (*layer_interface)->GetInstanceProcAddrFuncPointer();
                PFN_xrCreateApiLayerInstance cur_cali_fp = (*layer_interface)->GetCreateApiLayerInstanceFuncPointer();

                // Fill in layer info and link previous (lower) layer fxn pointers
                strncpy(next_info_list[ni_index].layerName, (*layer_interface)->LayerName().c_str(),
                        XR_MAX_API_LAYER_NAME_SIZE - 1);
                next_info_list[ni_index].layerName[XR_MAX_API_LAYER_NAME_SIZE - 1] = '\0';
                next_info_list[ni_index].next = topmost_nextinfo;
                next_info_list[ni_index].nextGetInstanceProcAddr = topmost_gipa;
                next_info_list[ni_index].nextCreateApiLayerInstance = topmost_cali_fp;

                // Update saved pointers for next iteration
                topmost_nextinfo = &next_info_list[ni_index];
                topmost_gipa = cur_gipa_fp;
                topmost_cali_fp = cur_cali_fp;
                ni_index--;
            }

            // Populate the ApiLayerCreateInfo struct and pass to topmost CreateApiLayerInstance()
            XrApiLayerCreateInfo api_layer_ci = {};
            api_layer_ci.structType = XR_LOADER_INTERFACE_STRUCT_API_LAYER_CREATE_INFO;
            api_layer_ci.structVersion = XR_API_LAYER_CREATE_INFO_STRUCT_VERSION;
            api_layer_ci.structSize = sizeof(XrApiLayerCreateInfo);
            api_layer_ci.loaderInstance = nullptr;  // Not used.
            api_layer_ci.settings_file_location[0] = '\0';
            api_layer_ci.nextInfo = next_info_list.get();
            //! @todo do we filter our create info extension list here?
            //! Think that actually each layer might need to filter...
            last_error = topmost_cali_fp(modified_create_info, &api_layer_ci, &instance);

        } else {
            // The loader's terminator is the topmost CreateInstance if there are no layers.
            last_error = create_instance_term(modified_create_info, &instance);
        }

        if (XR_FAILED(last_error)) {
            LoaderLogger::LogErrorMessage("xrCreateInstance", "LoaderInstance::CreateInstance chained CreateInstance call failed");
        }
    }

    if (XR_SUCCEEDED(last_error)) {
        loader_instance->reset(new LoaderInstance(instance, info, topmost_gipa, std::move(api_layer_interfaces)));

        std::ostringstream oss;
        oss << "LoaderInstance::CreateInstance succeeded with ";
        oss << (*loader_instance)->LayerInterfaces().size();
        oss << " layers enabled and runtime interface - created instance = ";
        oss << HandleToHexString((*loader_instance)->GetInstanceHandle());
        LoaderLogger::LogInfoMessage("xrCreateInstance", oss.str());
    }

    return last_error;
}